

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O1

void fill_lock_region(LockRegion *lr,float alphafactor,_Bool blended)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  
  if (0 < lock_region.h) {
    iVar1 = 0;
    do {
      if (0 < lock_region.w) {
        iVar2 = 0;
        do {
          fVar3 = (float)iVar2 / (float)(lock_region.w + -1);
          fVar4 = (float)iVar1 / (float)(lock_region.h + -1);
          al_map_rgba_f(fVar3,fVar3 * fVar4,fVar4,fVar3 * alphafactor);
          if ((char)lr == '\0') {
            al_put_pixel(lock_region.x + iVar2,lock_region.y + iVar1);
          }
          else {
            al_put_blended_pixel();
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < lock_region.w);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < lock_region.h);
  }
  return;
}

Assistant:

static void fill_lock_region(LockRegion *lr, float alphafactor, bool blended)
{
   int x, y;
   float r, g, b, a;
   ALLEGRO_COLOR c;

   for (y = 0; y < lr->h; y++) {
      for (x = 0; x < lr->w; x++) {
         /* -1 to make the last pixel use the full color, allows easier
          * manual inspection of the test results as we have a fixed
          * color on each side.
          */
         r = (float)x / (lr->w - 1);
         b = (float)y / (lr->h - 1);
         g = r*b;
         a = r * alphafactor;
         c = al_map_rgba_f(r, g, b, a);
         if (blended)
            al_put_blended_pixel(lr->x + x, lr->y + y, c);
         else
            al_put_pixel(lr->x + x, lr->y + y, c);
      }
   }
}